

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-keymap.c
# Opt level: O2

void keymap_free(void)

{
  keymap *pkVar1;
  keymap *p;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    p = keymaps[lVar2];
    while (p != (keymap *)0x0) {
      pkVar1 = p->next;
      mem_free(p->actions);
      mem_free(p);
      p = pkVar1;
    }
  }
  return;
}

Assistant:

void keymap_free(void)
{
	size_t i;
	struct keymap *k;
	for (i = 0; i < N_ELEMENTS(keymaps); i++) {
		k = keymaps[i];
		while (k) {
			struct keymap *next = k->next;
			mem_free(k->actions);
			mem_free(k);
			k = next;
		}
	}
}